

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::Method>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  LogMessage *other_00;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (other == this) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x6fb);
    other_00 = LogMessage::operator<<(&local_60,"CHECK failed: (&other) != (this): ");
    LogFinisher::operator=(&local_21,other_00);
    LogMessage::~LogMessage(&local_60);
  }
  if (other->current_size_ != 0) {
    MergeFromInternal(this,other,
                      (offset_in_RepeatedPtrFieldBase_to_subr)
                      MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::Method>::TypeHandler>
                     );
  }
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::MergeFrom(const RepeatedPtrFieldBase& other) {
  GOOGLE_DCHECK_NE(&other, this);
  if (other.current_size_ == 0) return;
  MergeFromInternal(other,
                    &RepeatedPtrFieldBase::MergeFromInnerLoop<TypeHandler>);
}